

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O2

SRC_STATE * linear_copy(SRC_STATE *state)

{
  undefined8 *puVar1;
  SRC_STATE_VT *pSVar2;
  double dVar3;
  undefined8 uVar4;
  SRC_STATE *__ptr;
  SRC_STATE *pSVar5;
  src_callback_t __dest;
  long lVar6;
  SRC_STATE *pSVar7;
  size_t __size;
  byte bVar8;
  
  bVar8 = 0;
  if (state == (SRC_STATE *)0x0) {
    __assert_fail("state != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_linear.c"
                  ,0xf9,"SRC_STATE *linear_copy(SRC_STATE *)");
  }
  puVar1 = (undefined8 *)state->private_data;
  if ((puVar1 != (undefined8 *)0x0) &&
     (__ptr = (SRC_STATE *)calloc(1,0x50), __ptr != (SRC_STATE *)0x0)) {
    pSVar5 = state;
    pSVar7 = __ptr;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      pSVar7->vt = pSVar5->vt;
      pSVar5 = (SRC_STATE *)((long)pSVar5 + (ulong)bVar8 * -0x10 + 8);
      pSVar7 = (SRC_STATE *)((long)pSVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    pSVar5 = (SRC_STATE *)calloc(1,0x30);
    if (pSVar5 != (SRC_STATE *)0x0) {
      *(undefined8 *)&pSVar5->mode = puVar1[4];
      pSVar2 = (SRC_STATE_VT *)*puVar1;
      dVar3 = (double)puVar1[1];
      uVar4 = puVar1[3];
      pSVar5->last_position = (double)puVar1[2];
      pSVar5->error = (int)uVar4;
      pSVar5->channels = (int)((ulong)uVar4 >> 0x20);
      pSVar5->vt = pSVar2;
      pSVar5->last_ratio = dVar3;
      __size = (long)state->channels << 2;
      __dest = (src_callback_t)malloc(__size);
      pSVar5->callback_func = __dest;
      if (__dest != (src_callback_t)0x0) {
        memcpy(__dest,(void *)puVar1[5],__size);
        __ptr->private_data = pSVar5;
        return __ptr;
      }
      free(__ptr);
      __ptr = pSVar5;
    }
    free(__ptr);
  }
  return (SRC_STATE *)0x0;
}

Assistant:

SRC_STATE *
linear_copy (SRC_STATE *state)
{
	assert (state != NULL) ;

	if (state->private_data == NULL)
		return NULL ;

	SRC_STATE *to = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!to)
		return NULL ;
	memcpy (to, state, sizeof (SRC_STATE)) ;

	LINEAR_DATA* from_priv = (LINEAR_DATA*) state->private_data ;
	LINEAR_DATA *to_priv = (LINEAR_DATA *) calloc (1, sizeof (LINEAR_DATA)) ;
	if (!to_priv)
	{
		free (to) ;
		return NULL ;
	}

	memcpy (to_priv, from_priv, sizeof (LINEAR_DATA)) ;
	to_priv->last_value = (float *) malloc (sizeof (float) * state->channels) ;
	if (!to_priv->last_value)
	{
		free (to) ;
		free (to_priv) ;
		return NULL ;
	}
	memcpy (to_priv->last_value, from_priv->last_value, sizeof (float) * state->channels) ;

	to->private_data = to_priv ;

	return to ;
}